

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  parasail_matrix_t *ppVar1;
  void *pvVar2;
  __m128i *palVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  parasail_result_t *ppVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar19;
  short sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *palVar24;
  int iVar25;
  int seglen;
  ushort uVar26;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar27 [16];
  ushort uVar36;
  undefined1 auVar28 [16];
  ulong uVar33;
  __m128i alVar37;
  ulong local_628;
  long local_618;
  long local_610;
  ulong uStack_5f8;
  __m128i vH_2;
  __m128i vH_1;
  int16_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_4fe;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_488;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_striped_profile_sse41_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_striped_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_striped_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_striped_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_striped_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_striped_profile_sse41_128_16","s2Len"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_striped_profile_sse41_128_16","open"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_striped_profile_sse41_128_16","gap")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar22 = profile->s1Len;
    local_488 = iVar22 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar1 = profile->matrix;
    iVar21 = (iVar22 + 7) / 8;
    iVar25 = (iVar22 + -1) % iVar21;
    iVar22 = ~((iVar22 + -1) / iVar21) + 8;
    pvVar2 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar4 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar7 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar5 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar8 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    if (ppVar1->min <= -open) {
      i._0_2_ = -(short)ppVar1->min;
    }
    sVar19 = (short)i + -0x7fff;
    sVar20 = ((ushort)ppVar1->max ^ 0x7fff) - 1;
    ppVar6 = (parasail_result_t *)CONCAT26(sVar19,CONCAT24(sVar19,CONCAT22(sVar19,sVar19)));
    lVar9 = CONCAT26(sVar19,CONCAT24(sVar19,CONCAT22(sVar19,sVar19)));
    vSaturationCheckMax[1] = CONCAT26(sVar20,CONCAT24(sVar20,CONCAT22(sVar20,sVar20)));
    vSaturationCheckMin[0] = CONCAT26(sVar20,CONCAT24(sVar20,CONCAT22(sVar20,sVar20)));
    seglen = gap;
    result = ppVar6;
    vSaturationCheckMax[0] = lVar9;
    _segNum = (parasail_profile_t *)parasail_result_new_rowcol1(iVar21 * 8,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8200801;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar21);
      pvE = parasail_memalign___m128i(0x10,(long)iVar21);
      ptr = parasail_memalign___m128i(0x10,(long)iVar21);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar21; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_618 = (long)(-(gap * (h.m[1]._0_4_ * iVar21 + k)) - open);
            local_610 = local_618;
            if (local_618 < -0x8000) {
              local_610 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_610;
            local_618 = local_618 - open;
            if (local_618 < -0x8000) {
              local_618 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_618;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar23 = -(gap * (k + -1)) - open;
          if (iVar23 < -0x8000) {
            iVar23 = -0x8000;
          }
          ptr_00[k] = (int16_t)iVar23;
        }
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar9;
          vH[1] = (longlong)ppVar6;
          uVar33 = pvHLoad[iVar21 + -1][0];
          iVar23 = ppVar1->mapper[(byte)s2[s1Len]];
          palVar3 = pvE;
          vH[0] = pvHLoad[iVar21 + -1][1] << 0x10 | uVar33 >> 0x30;
          vP = (__m128i *)(uVar33 << 0x10 | (ulong)(ushort)ptr_00[s1Len]);
          for (k = 0; k < iVar21; k = k + 1) {
            auVar27 = paddsw((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar2 + (long)k * 0x10 + (long)(iVar23 * iVar21) * 0x10));
            palVar24 = ptr + k;
            lVar10 = (*palVar24)[0];
            lVar11 = (*palVar24)[1];
            alVar37 = *palVar24;
            local_278 = auVar27._0_2_;
            sStack_276 = auVar27._2_2_;
            sStack_274 = auVar27._4_2_;
            sStack_272 = auVar27._6_2_;
            sStack_270 = auVar27._8_2_;
            sStack_26e = auVar27._10_2_;
            sStack_26c = auVar27._12_2_;
            sStack_26a = auVar27._14_2_;
            local_288 = (short)lVar10;
            sStack_286 = (short)((ulong)lVar10 >> 0x10);
            sStack_284 = (short)((ulong)lVar10 >> 0x20);
            sStack_282 = (short)((ulong)lVar10 >> 0x30);
            sStack_280 = (short)lVar11;
            sStack_27e = (short)((ulong)lVar11 >> 0x10);
            sStack_27c = (short)((ulong)lVar11 >> 0x20);
            sStack_27a = (short)((ulong)lVar11 >> 0x30);
            uVar26 = (ushort)(local_278 < local_288) * local_288 |
                     (ushort)(local_278 >= local_288) * local_278;
            uVar29 = (ushort)(sStack_276 < sStack_286) * sStack_286 |
                     (ushort)(sStack_276 >= sStack_286) * sStack_276;
            uVar30 = (ushort)(sStack_274 < sStack_284) * sStack_284 |
                     (ushort)(sStack_274 >= sStack_284) * sStack_274;
            uVar31 = (ushort)(sStack_272 < sStack_282) * sStack_282 |
                     (ushort)(sStack_272 >= sStack_282) * sStack_272;
            uVar32 = (ushort)(sStack_270 < sStack_280) * sStack_280 |
                     (ushort)(sStack_270 >= sStack_280) * sStack_270;
            uVar34 = (ushort)(sStack_26e < sStack_27e) * sStack_27e |
                     (ushort)(sStack_26e >= sStack_27e) * sStack_26e;
            uVar35 = (ushort)(sStack_26c < sStack_27c) * sStack_27c |
                     (ushort)(sStack_26c >= sStack_27c) * sStack_26c;
            uVar36 = (ushort)(sStack_26a < sStack_27a) * sStack_27a |
                     (ushort)(sStack_26a >= sStack_27a) * sStack_26a;
            local_2a8 = (short)vH[1];
            sStack_2a6 = vH[1]._2_2_;
            sStack_2a4 = vH[1]._4_2_;
            sStack_2a2 = vH[1]._6_2_;
            sStack_2a0 = (short)vH[2];
            sStack_29e = vH[2]._2_2_;
            sStack_29c = vH[2]._4_2_;
            sStack_29a = vH[2]._6_2_;
            uVar26 = (ushort)((short)uVar26 < local_2a8) * local_2a8 |
                     ((short)uVar26 >= local_2a8) * uVar26;
            uVar29 = (ushort)((short)uVar29 < sStack_2a6) * sStack_2a6 |
                     ((short)uVar29 >= sStack_2a6) * uVar29;
            uVar30 = (ushort)((short)uVar30 < sStack_2a4) * sStack_2a4 |
                     ((short)uVar30 >= sStack_2a4) * uVar30;
            uVar31 = (ushort)((short)uVar31 < sStack_2a2) * sStack_2a2 |
                     ((short)uVar31 >= sStack_2a2) * uVar31;
            uVar32 = (ushort)((short)uVar32 < sStack_2a0) * sStack_2a0 |
                     ((short)uVar32 >= sStack_2a0) * uVar32;
            uVar34 = (ushort)((short)uVar34 < sStack_29e) * sStack_29e |
                     ((short)uVar34 >= sStack_29e) * uVar34;
            uVar35 = (ushort)((short)uVar35 < sStack_29c) * sStack_29c |
                     ((short)uVar35 >= sStack_29c) * uVar35;
            uVar36 = (ushort)((short)uVar36 < sStack_29a) * sStack_29a |
                     ((short)uVar36 >= sStack_29a) * uVar36;
            vP._0_4_ = CONCAT22(uVar29,uVar26);
            vP._0_6_ = CONCAT24(uVar30,vP._0_4_);
            vP = (__m128i *)CONCAT26(uVar31,vP._0_6_);
            vH[0]._0_2_ = uVar32;
            vH[0]._2_2_ = uVar34;
            vH[0]._4_2_ = uVar35;
            vH[0]._6_2_ = uVar36;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vH[0];
            local_2b8 = (short)result;
            sStack_2b6 = (short)((ulong)result >> 0x10);
            sStack_2b4 = (short)((ulong)result >> 0x20);
            sStack_2b2 = (short)((ulong)result >> 0x30);
            sStack_2b0 = (short)vSaturationCheckMax[0];
            sStack_2ae = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_2ac = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_2aa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            result._0_4_ = CONCAT22((sStack_2b6 < (short)uVar29) * uVar29 |
                                    (ushort)(sStack_2b6 >= (short)uVar29) * sStack_2b6,
                                    (local_2b8 < (short)uVar26) * uVar26 |
                                    (ushort)(local_2b8 >= (short)uVar26) * local_2b8);
            result._0_6_ = CONCAT24((sStack_2b4 < (short)uVar30) * uVar30 |
                                    (ushort)(sStack_2b4 >= (short)uVar30) * sStack_2b4,result._0_4_)
            ;
            result = (parasail_result_t *)
                     CONCAT26((sStack_2b2 < (short)uVar31) * uVar31 |
                              (ushort)(sStack_2b2 >= (short)uVar31) * sStack_2b2,result._0_6_);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((sStack_2ae < (short)uVar34) * uVar34 |
                          (ushort)(sStack_2ae >= (short)uVar34) * sStack_2ae,
                          (sStack_2b0 < (short)uVar32) * uVar32 |
                          (ushort)(sStack_2b0 >= (short)uVar32) * sStack_2b0);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((sStack_2ac < (short)uVar35) * uVar35 |
                          (ushort)(sStack_2ac >= (short)uVar35) * sStack_2ac,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_2aa < (short)uVar36) * uVar36 |
                          (ushort)(sStack_2aa >= (short)uVar36) * sStack_2aa,
                          (undefined6)vSaturationCheckMax[0]);
            local_1f8 = (short)vSaturationCheckMax[1];
            sStack_1f6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_1f4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_1f2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_1f0 = (short)vSaturationCheckMin[0];
            sStack_1ee = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_1ec = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_1ea = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            uVar26 = ((short)uVar26 < local_1f8) * uVar26 |
                     (ushort)((short)uVar26 >= local_1f8) * local_1f8;
            uVar29 = ((short)uVar29 < sStack_1f6) * uVar29 |
                     (ushort)((short)uVar29 >= sStack_1f6) * sStack_1f6;
            uVar30 = ((short)uVar30 < sStack_1f4) * uVar30 |
                     (ushort)((short)uVar30 >= sStack_1f4) * sStack_1f4;
            uVar31 = ((short)uVar31 < sStack_1f2) * uVar31 |
                     (ushort)((short)uVar31 >= sStack_1f2) * sStack_1f2;
            uVar32 = ((short)uVar32 < sStack_1f0) * uVar32 |
                     (ushort)((short)uVar32 >= sStack_1f0) * sStack_1f0;
            uVar34 = ((short)uVar34 < sStack_1ee) * uVar34 |
                     (ushort)((short)uVar34 >= sStack_1ee) * sStack_1ee;
            uVar35 = ((short)uVar35 < sStack_1ec) * uVar35 |
                     (ushort)((short)uVar35 >= sStack_1ec) * sStack_1ec;
            uVar36 = ((short)uVar36 < sStack_1ea) * uVar36 |
                     (ushort)((short)uVar36 >= sStack_1ea) * sStack_1ea;
            uVar26 = (ushort)(local_288 < (short)uVar26) * local_288 |
                     (local_288 >= (short)uVar26) * uVar26;
            uVar29 = (ushort)(sStack_286 < (short)uVar29) * sStack_286 |
                     (sStack_286 >= (short)uVar29) * uVar29;
            uVar30 = (ushort)(sStack_284 < (short)uVar30) * sStack_284 |
                     (sStack_284 >= (short)uVar30) * uVar30;
            uVar31 = (ushort)(sStack_282 < (short)uVar31) * sStack_282 |
                     (sStack_282 >= (short)uVar31) * uVar31;
            uVar32 = (ushort)(sStack_280 < (short)uVar32) * sStack_280 |
                     (sStack_280 >= (short)uVar32) * uVar32;
            uVar34 = (ushort)(sStack_27e < (short)uVar34) * sStack_27e |
                     (sStack_27e >= (short)uVar34) * uVar34;
            uVar35 = (ushort)(sStack_27c < (short)uVar35) * sStack_27c |
                     (sStack_27c >= (short)uVar35) * uVar35;
            uVar36 = (ushort)(sStack_27a < (short)uVar36) * sStack_27a |
                     (sStack_27a >= (short)uVar36) * uVar36;
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22((ushort)(sStack_2a6 < (short)uVar29) * sStack_2a6 |
                          (sStack_2a6 >= (short)uVar29) * uVar29,
                          (ushort)(local_2a8 < (short)uVar26) * local_2a8 |
                          (local_2a8 >= (short)uVar26) * uVar26);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24((ushort)(sStack_2a4 < (short)uVar30) * sStack_2a4 |
                          (sStack_2a4 >= (short)uVar30) * uVar30,(undefined4)vSaturationCheckMax[1])
            ;
            vSaturationCheckMax[1] =
                 CONCAT26((ushort)(sStack_2a2 < (short)uVar31) * sStack_2a2 |
                          (sStack_2a2 >= (short)uVar31) * uVar31,(undefined6)vSaturationCheckMax[1])
            ;
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22((ushort)(sStack_29e < (short)uVar34) * sStack_29e |
                          (sStack_29e >= (short)uVar34) * uVar34,
                          (ushort)(sStack_2a0 < (short)uVar32) * sStack_2a0 |
                          (sStack_2a0 >= (short)uVar32) * uVar32);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24((ushort)(sStack_29c < (short)uVar35) * sStack_29c |
                          (sStack_29c >= (short)uVar35) * uVar35,(undefined4)vSaturationCheckMin[0])
            ;
            vSaturationCheckMin[0] =
                 CONCAT26((ushort)(sStack_29a < (short)uVar36) * sStack_29a |
                          (sStack_29a >= (short)uVar36) * uVar36,(undefined6)vSaturationCheckMin[0])
            ;
            auVar16._8_8_ = vH[0];
            auVar16._0_8_ = vP;
            auVar15._8_8_ = uVar7;
            auVar15._0_8_ = uVar4;
            auVar27 = psubsw(auVar16,auVar15);
            auVar28._8_8_ = uVar8;
            auVar28._0_8_ = uVar5;
            auVar28 = psubsw((undefined1  [16])alVar37,auVar28);
            local_2d8 = auVar28._0_2_;
            sStack_2d6 = auVar28._2_2_;
            sStack_2d4 = auVar28._4_2_;
            sStack_2d2 = auVar28._6_2_;
            sStack_2d0 = auVar28._8_2_;
            sStack_2ce = auVar28._10_2_;
            sStack_2cc = auVar28._12_2_;
            sStack_2ca = auVar28._14_2_;
            local_2e8 = auVar27._0_2_;
            sStack_2e6 = auVar27._2_2_;
            sStack_2e4 = auVar27._4_2_;
            sStack_2e2 = auVar27._6_2_;
            sStack_2e0 = auVar27._8_2_;
            sStack_2de = auVar27._10_2_;
            sStack_2dc = auVar27._12_2_;
            sStack_2da = auVar27._14_2_;
            vF[1] = CONCAT26((ushort)(sStack_2d2 < sStack_2e2) * sStack_2e2 |
                             (ushort)(sStack_2d2 >= sStack_2e2) * sStack_2d2,
                             CONCAT24((ushort)(sStack_2d4 < sStack_2e4) * sStack_2e4 |
                                      (ushort)(sStack_2d4 >= sStack_2e4) * sStack_2d4,
                                      CONCAT22((ushort)(sStack_2d6 < sStack_2e6) * sStack_2e6 |
                                               (ushort)(sStack_2d6 >= sStack_2e6) * sStack_2d6,
                                               (ushort)(local_2d8 < local_2e8) * local_2e8 |
                                               (ushort)(local_2d8 >= local_2e8) * local_2d8)));
            vE[0]._0_2_ = (ushort)(sStack_2d0 < sStack_2e0) * sStack_2e0 |
                          (ushort)(sStack_2d0 >= sStack_2e0) * sStack_2d0;
            vE[0]._2_2_ = (ushort)(sStack_2ce < sStack_2de) * sStack_2de |
                          (ushort)(sStack_2ce >= sStack_2de) * sStack_2ce;
            vE[0]._4_2_ = (ushort)(sStack_2cc < sStack_2dc) * sStack_2dc |
                          (ushort)(sStack_2cc >= sStack_2dc) * sStack_2cc;
            vE[0]._6_2_ = (ushort)(sStack_2ca < sStack_2da) * sStack_2da |
                          (ushort)(sStack_2ca >= sStack_2da) * sStack_2ca;
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            auVar27._8_8_ = uVar8;
            auVar27._0_8_ = uVar5;
            auVar27 = psubsw(stack0xfffffffffffffa58,auVar27);
            local_2f8 = auVar27._0_2_;
            sStack_2f6 = auVar27._2_2_;
            sStack_2f4 = auVar27._4_2_;
            sStack_2f2 = auVar27._6_2_;
            sStack_2f0 = auVar27._8_2_;
            sStack_2ee = auVar27._10_2_;
            sStack_2ec = auVar27._12_2_;
            sStack_2ea = auVar27._14_2_;
            vH[1] = CONCAT26((ushort)(sStack_2f2 < sStack_2e2) * sStack_2e2 |
                             (ushort)(sStack_2f2 >= sStack_2e2) * sStack_2f2,
                             CONCAT24((ushort)(sStack_2f4 < sStack_2e4) * sStack_2e4 |
                                      (ushort)(sStack_2f4 >= sStack_2e4) * sStack_2f4,
                                      CONCAT22((ushort)(sStack_2f6 < sStack_2e6) * sStack_2e6 |
                                               (ushort)(sStack_2f6 >= sStack_2e6) * sStack_2f6,
                                               (ushort)(local_2f8 < local_2e8) * local_2e8 |
                                               (ushort)(local_2f8 >= local_2e8) * local_2f8)));
            vF[0]._0_2_ = (ushort)(sStack_2f0 < sStack_2e0) * sStack_2e0 |
                          (ushort)(sStack_2f0 >= sStack_2e0) * sStack_2f0;
            vF[0]._2_2_ = (ushort)(sStack_2ee < sStack_2de) * sStack_2de |
                          (ushort)(sStack_2ee >= sStack_2de) * sStack_2ee;
            vF[0]._4_2_ = (ushort)(sStack_2ec < sStack_2dc) * sStack_2dc |
                          (ushort)(sStack_2ec >= sStack_2dc) * sStack_2ec;
            vF[0]._6_2_ = (ushort)(sStack_2ea < sStack_2da) * sStack_2da |
                          (ushort)(sStack_2ea >= sStack_2da) * sStack_2ea;
            _vP = pvHLoad[k];
          }
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            local_628 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)local_628 < -0x8000) {
              local_628 = 0xffffffffffff8000;
            }
            vF[0] = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | local_628 & 0xffff;
            for (k = 0; k < iVar21; k = k + 1) {
              lVar10 = pvE[k][0];
              lVar11 = pvE[k][1];
              local_318 = (short)lVar10;
              sStack_316 = (short)((ulong)lVar10 >> 0x10);
              sStack_314 = (short)((ulong)lVar10 >> 0x20);
              sStack_312 = (short)((ulong)lVar10 >> 0x30);
              sStack_310 = (short)lVar11;
              sStack_30e = (short)((ulong)lVar11 >> 0x10);
              sStack_30c = (short)((ulong)lVar11 >> 0x20);
              sStack_30a = (short)((ulong)lVar11 >> 0x30);
              local_328 = (short)vH[1];
              sStack_326 = vH[1]._2_2_;
              sStack_324 = vH[1]._4_2_;
              sStack_322 = vH[1]._6_2_;
              sStack_320 = (short)vH[2];
              sStack_31e = vH[2]._2_2_;
              sStack_31c = vH[2]._4_2_;
              sStack_31a = vH[2]._6_2_;
              uVar26 = (ushort)(local_318 < local_328) * local_328 |
                       (ushort)(local_318 >= local_328) * local_318;
              uVar29 = (ushort)(sStack_316 < sStack_326) * sStack_326 |
                       (ushort)(sStack_316 >= sStack_326) * sStack_316;
              uVar30 = (ushort)(sStack_314 < sStack_324) * sStack_324 |
                       (ushort)(sStack_314 >= sStack_324) * sStack_314;
              uVar31 = (ushort)(sStack_312 < sStack_322) * sStack_322 |
                       (ushort)(sStack_312 >= sStack_322) * sStack_312;
              uVar32 = (ushort)(sStack_310 < sStack_320) * sStack_320 |
                       (ushort)(sStack_310 >= sStack_320) * sStack_310;
              uVar34 = (ushort)(sStack_30e < sStack_31e) * sStack_31e |
                       (ushort)(sStack_30e >= sStack_31e) * sStack_30e;
              uVar35 = (ushort)(sStack_30c < sStack_31c) * sStack_31c |
                       (ushort)(sStack_30c >= sStack_31c) * sStack_30c;
              uVar36 = (ushort)(sStack_30a < sStack_31a) * sStack_31a |
                       (ushort)(sStack_30a >= sStack_31a) * sStack_30a;
              vP._0_4_ = CONCAT22(uVar29,uVar26);
              vP._0_6_ = CONCAT24(uVar30,vP._0_4_);
              vP = (__m128i *)CONCAT26(uVar31,vP._0_6_);
              vH[0]._0_2_ = uVar32;
              vH[0]._2_2_ = uVar34;
              vH[0]._4_2_ = uVar35;
              vH[0]._6_2_ = uVar36;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vH[0];
              local_258 = (short)vSaturationCheckMax[1];
              sStack_256 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_254 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_252 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_250 = (short)vSaturationCheckMin[0];
              sStack_24e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_24c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_24a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar29 < sStack_256) * uVar29 |
                            (ushort)((short)uVar29 >= sStack_256) * sStack_256,
                            ((short)uVar26 < local_258) * uVar26 |
                            (ushort)((short)uVar26 >= local_258) * local_258);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar30 < sStack_254) * uVar30 |
                            (ushort)((short)uVar30 >= sStack_254) * sStack_254,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar31 < sStack_252) * uVar31 |
                            (ushort)((short)uVar31 >= sStack_252) * sStack_252,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar34 < sStack_24e) * uVar34 |
                            (ushort)((short)uVar34 >= sStack_24e) * sStack_24e,
                            ((short)uVar32 < sStack_250) * uVar32 |
                            (ushort)((short)uVar32 >= sStack_250) * sStack_250);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar35 < sStack_24c) * uVar35 |
                            (ushort)((short)uVar35 >= sStack_24c) * sStack_24c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar36 < sStack_24a) * uVar36 |
                            (ushort)((short)uVar36 >= sStack_24a) * sStack_24a,
                            (undefined6)vSaturationCheckMin[0]);
              local_338 = (short)result;
              sStack_336 = (short)((ulong)result >> 0x10);
              sStack_334 = (short)((ulong)result >> 0x20);
              sStack_332 = (short)((ulong)result >> 0x30);
              sStack_330 = (short)vSaturationCheckMax[0];
              sStack_32e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_32c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_32a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              result._0_4_ = CONCAT22((sStack_336 < (short)uVar29) * uVar29 |
                                      (ushort)(sStack_336 >= (short)uVar29) * sStack_336,
                                      (local_338 < (short)uVar26) * uVar26 |
                                      (ushort)(local_338 >= (short)uVar26) * local_338);
              result._0_6_ = CONCAT24((sStack_334 < (short)uVar30) * uVar30 |
                                      (ushort)(sStack_334 >= (short)uVar30) * sStack_334,
                                      result._0_4_);
              result = (parasail_result_t *)
                       CONCAT26((sStack_332 < (short)uVar31) * uVar31 |
                                (ushort)(sStack_332 >= (short)uVar31) * sStack_332,result._0_6_);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((sStack_32e < (short)uVar34) * uVar34 |
                            (ushort)(sStack_32e >= (short)uVar34) * sStack_32e,
                            (sStack_330 < (short)uVar32) * uVar32 |
                            (ushort)(sStack_330 >= (short)uVar32) * sStack_330);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((sStack_32c < (short)uVar35) * uVar35 |
                            (ushort)(sStack_32c >= (short)uVar35) * sStack_32c,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((sStack_32a < (short)uVar36) * uVar36 |
                            (ushort)(sStack_32a >= (short)uVar36) * sStack_32a,
                            (undefined6)vSaturationCheckMax[0]);
              auVar14._8_8_ = vH[0];
              auVar14._0_8_ = vP;
              auVar13._8_8_ = uVar7;
              auVar13._0_8_ = uVar4;
              auVar27 = psubsw(auVar14,auVar13);
              auVar12._8_8_ = uVar8;
              auVar12._0_8_ = uVar5;
              register0x00001200 = psubsw(stack0xfffffffffffffa58,auVar12);
              local_f8 = (short)vH[1];
              sStack_f6 = vH[1]._2_2_;
              sStack_f4 = vH[1]._4_2_;
              sStack_f2 = vH[1]._6_2_;
              sStack_f0 = (short)vH[2];
              sStack_ee = vH[2]._2_2_;
              sStack_ec = vH[2]._4_2_;
              sStack_ea = vH[2]._6_2_;
              local_108 = auVar27._0_2_;
              sStack_106 = auVar27._2_2_;
              sStack_104 = auVar27._4_2_;
              sStack_102 = auVar27._6_2_;
              sStack_100 = auVar27._8_2_;
              sStack_fe = auVar27._10_2_;
              sStack_fc = auVar27._12_2_;
              sStack_fa = auVar27._14_2_;
              uVar26 = -(ushort)(sStack_fa < sStack_ea);
              auVar18._2_2_ = -(ushort)(sStack_106 < sStack_f6);
              auVar18._0_2_ = -(ushort)(local_108 < local_f8);
              auVar18._4_2_ = -(ushort)(sStack_104 < sStack_f4);
              auVar18._6_2_ = -(ushort)(sStack_102 < sStack_f2);
              auVar18._8_2_ = -(ushort)(sStack_100 < sStack_f0);
              auVar18._10_2_ = -(ushort)(sStack_fe < sStack_ee);
              auVar18._12_2_ = -(ushort)(sStack_fc < sStack_ec);
              auVar18._14_2_ = uVar26;
              if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar18 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar18 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar18 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar18 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar18 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar18 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar18 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar18 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar18 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar18 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (uVar26 >> 7 & 1) == 0) && sStack_fa >= sStack_ea) goto LAB_00a70ac7;
            }
          }
LAB_00a70ac7:
          _vP = pvE[iVar25];
          for (end_query = 0; end_query < iVar22; end_query = end_query + 1) {
            vH[0] = vH[0] << 0x10 | (ulong)vP >> 0x30;
            vP = (__m128i *)((long)vP << 0x10);
          }
          ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols->score_row
          [s1Len] = (int)vH[0]._6_2_;
          pvE = pvHLoad;
          pvHLoad = palVar3;
        }
        for (k = 0; k < iVar21; k = k + 1) {
          alVar37[0] = (ulong)(uint)k;
          alVar37[1]._0_4_ = iVar21;
          alVar37[1]._4_4_ = 0;
          arr_store_col(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->rowcols
                        ->score_col,alVar37,k * 0x10,seglen);
        }
        vH_2[0] = pvHLoad[iVar25][1];
        uStack_5f8 = pvHLoad[iVar25][0];
        for (end_query = 0; end_query < iVar22; end_query = end_query + 1) {
          vH_2[0] = vH_2[0] << 0x10 | uStack_5f8 >> 0x30;
          uStack_5f8 = uStack_5f8 << 0x10;
        }
        local_4fe = vH_2[0]._6_2_;
        local_a8 = (short)vSaturationCheckMax[1];
        sStack_a6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_a4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_a2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_a0 = (short)vSaturationCheckMin[0];
        sStack_9e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_9c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_9a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_118 = (short)result;
        sStack_116 = (short)((ulong)result >> 0x10);
        sStack_114 = (short)((ulong)result >> 0x20);
        sStack_112 = (short)((ulong)result >> 0x30);
        sStack_110 = (short)vSaturationCheckMax[0];
        sStack_10e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_10c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_10a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar33 = CONCAT26(-(ushort)(sStack_9a < sVar19),
                          CONCAT24(-(ushort)(sStack_9c < sVar19),
                                   CONCAT22(-(ushort)(sStack_9e < sVar19),
                                            -(ushort)(sStack_a0 < sVar19)))) |
                 CONCAT26(-(ushort)(sVar20 < sStack_10a),
                          CONCAT24(-(ushort)(sVar20 < sStack_10c),
                                   CONCAT22(-(ushort)(sVar20 < sStack_10e),
                                            -(ushort)(sVar20 < sStack_110))));
        auVar17._8_8_ = uVar33;
        auVar17._0_8_ =
             CONCAT26(-(ushort)(sStack_a2 < sVar19),
                      CONCAT24(-(ushort)(sStack_a4 < sVar19),
                               CONCAT22(-(ushort)(sStack_a6 < sVar19),-(ushort)(local_a8 < sVar19)))
                     ) |
             CONCAT26(-(ushort)(sVar20 < sStack_112),
                      CONCAT24(-(ushort)(sVar20 < sStack_114),
                               CONCAT22(-(ushort)(sVar20 < sStack_116),-(ushort)(sVar20 < local_118)
                                       )));
        if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar33 >> 7 & 1) != 0) || (uVar33 >> 0xf & 1) != 0) || (uVar33 >> 0x17 & 1) != 0)
               || (uVar33 >> 0x1f & 1) != 0) || (uVar33 >> 0x27 & 1) != 0) ||
             (uVar33 >> 0x2f & 1) != 0) || (uVar33 >> 0x37 & 1) != 0) || (long)uVar33 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_4fe = 0;
          local_488 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_4fe;
        *(int *)((long)&_segNum->s1 + 4) = local_488;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}